

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Int8_To_UInt8(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  char cVar1;
  
  if (count != 0) {
    do {
      cVar1 = *sourceBuffer;
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
      *(char *)destinationBuffer = cVar1 + -0x80;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int8_To_UInt8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    signed char *src = (signed char*)sourceBuffer;
    unsigned char *dest =  (unsigned char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        (*dest) = (unsigned char)(*src + 128);

        src += sourceStride;
        dest += destinationStride;
    }
}